

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void ft_glyphslot_done(FT_GlyphSlot slot)

{
  FT_Driver pFVar1;
  FT_Memory pFVar2;
  FT_Driver_Class pFVar3;
  undefined8 *puVar4;
  void *pvVar5;
  FT_Slot_DoneFunc p_Var6;
  FT_Slot_Internal pFVar7;
  uint uVar8;
  
  pFVar1 = slot->face->driver;
  pFVar2 = (pFVar1->root).memory;
  pFVar3 = pFVar1->clazz;
  if ((slot->face->face_flags & 0x10000) != 0) {
    pFVar7 = slot->internal;
    if ((pFVar7 != (FT_Slot_Internal)0x0) && (uVar8 = pFVar7->flags, (uVar8 & 2) != 0)) {
      puVar4 = (undefined8 *)slot->other;
      pvVar5 = (void *)*puVar4;
      if (pvVar5 != (void *)0x0) {
        (*pFVar2->free)(pFVar2,pvVar5);
        pFVar7 = slot->internal;
        uVar8 = pFVar7->flags;
      }
      *puVar4 = 0;
      pFVar7->flags = uVar8 & 0xfffffffd;
    }
    if (slot->other != (void *)0x0) {
      (*pFVar2->free)(pFVar2,slot->other);
    }
    slot->other = (void *)0x0;
  }
  p_Var6 = pFVar3->done_slot;
  if (p_Var6 != (FT_Slot_DoneFunc)0x0) {
    (*p_Var6)(slot);
  }
  ft_glyphslot_free_bitmap(slot);
  pFVar7 = slot->internal;
  if (pFVar7 != (FT_Slot_Internal)0x0) {
    if ((((pFVar1->root).clazz)->module_flags & 0x200) == 0) {
      FT_GlyphLoader_Done(pFVar7->loader);
      pFVar7 = slot->internal;
      pFVar7->loader = (FT_GlyphLoader)0x0;
    }
    (*pFVar2->free)(pFVar2,pFVar7);
    slot->internal = (FT_Slot_Internal)0x0;
  }
  return;
}

Assistant:

static void
  ft_glyphslot_done( FT_GlyphSlot  slot )
  {
    FT_Driver        driver = slot->face->driver;
    FT_Driver_Class  clazz  = driver->clazz;
    FT_Memory        memory = driver->root.memory;

#ifdef FT_CONFIG_OPTION_SVG
    if ( slot->face->face_flags & FT_FACE_FLAG_SVG )
    {
      /* Free memory in case SVG was there.                          */
      /* `slot->internal` might be NULL in out-of-memory situations. */
      if ( slot->internal && slot->internal->flags & FT_GLYPH_OWN_GZIP_SVG )
      {
        FT_SVG_Document  doc = (FT_SVG_Document)slot->other;


        FT_FREE( doc->svg_document );

        slot->internal->flags &= ~FT_GLYPH_OWN_GZIP_SVG;
      }

      FT_FREE( slot->other );
    }
#endif

    if ( clazz->done_slot )
      clazz->done_slot( slot );

    /* free bitmap buffer if needed */
    ft_glyphslot_free_bitmap( slot );

    /* slot->internal might be NULL in out-of-memory situations */
    if ( slot->internal )
    {
      /* free glyph loader */
      if ( FT_DRIVER_USES_OUTLINES( driver ) )
      {
        FT_GlyphLoader_Done( slot->internal->loader );
        slot->internal->loader = NULL;
      }

      FT_FREE( slot->internal );
    }
  }